

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbMan.c
# Opt level: O2

Rsb_Man_t * Rsb_ManAlloc(int nLeafMax,int nDivMax,int nDecMax,int fVerbose)

{
  uint __line;
  Rsb_Man_t *pRVar1;
  Vec_Wrd_t *pVVar2;
  word *pwVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  char *__assertion;
  
  if (nLeafMax < 0x15) {
    if (nDivMax < 0xc9) {
      pRVar1 = (Rsb_Man_t *)calloc(1,0x38);
      pRVar1->nLeafMax = nLeafMax;
      pRVar1->nDivMax = nDivMax;
      pRVar1->nDecMax = nDecMax;
      pRVar1->fVerbose = fVerbose;
      pVVar2 = (Vec_Wrd_t *)malloc(0x10);
      iVar5 = 0x10;
      if (0xe < nDivMax + 0x95U) {
        iVar5 = nDivMax + 0x96;
      }
      pVVar2->nSize = 0;
      pVVar2->nCap = iVar5;
      if (iVar5 == 0) {
        pwVar3 = (word *)0x0;
      }
      else {
        pwVar3 = (word *)malloc((long)iVar5 << 3);
      }
      pVVar2->pArray = pwVar3;
      pRVar1->vCexes = pVVar2;
      iVar5 = 1 << ((char)nLeafMax - 6U & 0x1f);
      if (nLeafMax < 7) {
        iVar5 = 1;
      }
      pVVar4 = Vec_IntAlloc(iVar5);
      pRVar1->vDecPats = pVVar4;
      pVVar4 = Vec_IntAlloc(10);
      pRVar1->vFanins = pVVar4;
      pVVar4 = Vec_IntAlloc(10);
      pRVar1->vFaninsOld = pVVar4;
      pVVar4 = Vec_IntAlloc(10);
      pRVar1->vTries = pVVar4;
      return pRVar1;
    }
    __assertion = "nDivMax <= 200";
    __line = 0x31;
  }
  else {
    __assertion = "nLeafMax <= 20";
    __line = 0x30;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/rsb/rsbMan.c"
                ,__line,"Rsb_Man_t *Rsb_ManAlloc(int, int, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Rsb_Man_t * Rsb_ManAlloc( int nLeafMax, int nDivMax, int nDecMax, int fVerbose )
{
    Rsb_Man_t * p;
    assert( nLeafMax <= 20 );
    assert( nDivMax  <= 200 );
    p = ABC_CALLOC( Rsb_Man_t, 1 );
    p->nLeafMax   = nLeafMax;
    p->nDivMax    = nDivMax;
    p->nDecMax    = nDecMax;
    p->fVerbose   = fVerbose;
    // decomposition
    p->vCexes     = Vec_WrdAlloc( nDivMax + 150 );
    p->vDecPats   = Vec_IntAlloc( Abc_TtWordNum(nLeafMax) );
    p->vFanins    = Vec_IntAlloc( 10 );
    p->vFaninsOld = Vec_IntAlloc( 10 );
    p->vTries     = Vec_IntAlloc( 10 );
    return p;
}